

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbs.c
# Opt level: O2

int Wla_ManShrinkAbs(Wla_Man_t *pWla,int nFrames,int RunId)

{
  uint first_sel_pi;
  int *__s;
  int iVar1;
  uint uVar2;
  int iVar3;
  int iLit1;
  uint uVar4;
  Vec_Int_t *vBlacks;
  Vec_Int_t *vPPIs;
  abctime aVar5;
  Wlc_Ntk_t *pWVar6;
  Gia_Man_t *p;
  Gia_Man_t *p_00;
  char *pcVar7;
  Gia_Obj_t *pGVar8;
  Gia_Obj_t *pGVar9;
  Gia_Man_t *pFrames;
  Vec_Bit_t *p_01;
  Vec_Int_t *p_02;
  abctime aVar10;
  abctime time;
  int iVar11;
  Vec_Bit_t *pVVar12;
  int in_R9D;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  Wlc_Par_t *in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff90;
  
  vBlacks = Wla_ManCollectNodes(pWla,0);
  vPPIs = Wla_ManCollectNodes(pWla,1);
  pWVar6 = pWla->p;
  aVar5 = Abc_Clock();
  if ((vBlacks == (Vec_Int_t *)0x0) || (first_sel_pi = vBlacks->nSize, first_sel_pi == 0)) {
    __assert_fail("vWhites && Vec_IntSize(vWhites)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcAbs.c"
                  ,0x2b4,
                  "Vec_Bit_t *Wlc_NtkProofReduce(Wlc_Ntk_t *, Wlc_Par_t *, int, Vec_Int_t *, Vec_Int_t *, int)"
                 );
  }
  pWVar6 = Wlc_NtkIntroduceChoices(pWVar6,vBlacks,vPPIs);
  iVar1 = Wlc_NtkNumPiBits(pWVar6);
  iVar11 = 0;
  p = Wlc_NtkBitBlast(pWVar6,(Wlc_BstPar_t *)0x0);
  p_00 = Gia_ManStart(10000);
  pcVar7 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar7;
  Gia_ManHashAlloc(p_00);
  p->pObjs->Value = 0;
  while ((iVar11 < p->nRegs &&
         (pGVar8 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar11), pGVar8 != (Gia_Obj_t *)0x0)))
  {
    pGVar8->Value = 0;
    iVar11 = iVar11 + 1;
  }
  iVar11 = 0;
  if (nFrames < 1) {
    nFrames = 0;
  }
  for (; iVar11 != nFrames; iVar11 = iVar11 + 1) {
    for (iVar16 = 0; iVar3 = p->nRegs, iVar16 < p->vCis->nSize - iVar3; iVar16 = iVar16 + 1) {
      if (((iVar11 == 0) || (iVar16 < (int)(iVar1 - first_sel_pi))) || (iVar1 <= iVar16)) {
        uVar2 = Gia_ManAppendCi(p_00);
        pGVar8 = Gia_ManPi(p,iVar16);
        pGVar8->Value = uVar2;
      }
    }
    iVar16 = 0;
    while (((iVar16 < iVar3 &&
            (pGVar8 = Gia_ManCo(p,(p->vCos->nSize - iVar3) + iVar16), pGVar8 != (Gia_Obj_t *)0x0))
           && (pGVar9 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar16),
              pGVar9 != (Gia_Obj_t *)0x0))) {
      pGVar9->Value = pGVar8->Value;
      iVar16 = iVar16 + 1;
      iVar3 = p->nRegs;
    }
    iVar16 = 0;
    while ((iVar16 < p->nObjs && (pGVar8 = Gia_ManObj(p,iVar16), pGVar8 != (Gia_Obj_t *)0x0))) {
      if ((~*(uint *)pGVar8 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar8) {
        iVar3 = Gia_ObjFanin0Copy(pGVar8);
        iLit1 = Gia_ObjFanin1Copy(pGVar8);
        uVar2 = Gia_ManHashAnd(p_00,iVar3,iLit1);
        pGVar8->Value = uVar2;
      }
      iVar16 = iVar16 + 1;
    }
    iVar16 = 0;
    while ((iVar16 < p->vCos->nSize && (pGVar8 = Gia_ManCo(p,iVar16), pGVar8 != (Gia_Obj_t *)0x0)))
    {
      uVar2 = Gia_ObjFanin0Copy(pGVar8);
      pGVar8->Value = uVar2;
      iVar16 = iVar16 + 1;
    }
    iVar16 = 0;
    while ((iVar16 < p->vCos->nSize - p->nRegs &&
           (pGVar8 = Gia_ManCo(p,iVar16), pGVar8 != (Gia_Obj_t *)0x0))) {
      Gia_ManAppendCo(p_00,pGVar8->Value);
      iVar16 = iVar16 + 1;
    }
  }
  Gia_ManHashStop(p_00);
  uVar15 = 0;
  Gia_ManSetRegNum(p_00,0);
  pFrames = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  Gia_ManStop(p);
  uVar2 = (((int)first_sel_pi >> 5) + 1) - (uint)((first_sel_pi & 0x1f) == 0);
  p_01 = Vec_BitAlloc(uVar2 * 0x20);
  p_01->nSize = uVar2 * 0x20;
  __s = p_01->pArray;
  memset(__s,0xff,(long)(int)uVar2 << 2);
  p_02 = Wlc_NtkGetCoreSels(pFrames,iVar1 - first_sel_pi,first_sel_pi,(int)p_01,
                            (Vec_Bit_t *)(ulong)(uint)RunId,in_R9D,in_stack_ffffffffffffff88,
                            in_stack_ffffffffffffff90,nFrames);
  Wlc_NtkFree(pWVar6);
  Gia_ManStop(pFrames);
  if (p_02 != (Vec_Int_t *)0x0) {
    uVar14 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar14 = uVar15;
    }
    for (; uVar14 != uVar15; uVar15 = uVar15 + 1) {
      __s[uVar15] = 0;
    }
    iVar1 = p_02->nSize;
    iVar11 = 0;
    if (iVar1 < 1) {
      iVar1 = 0;
    }
    for (; iVar1 != iVar11; iVar11 = iVar11 + 1) {
      iVar16 = Vec_IntEntry(p_02,iVar11);
      Vec_BitWriteEntry(p_01,iVar16,1);
    }
    pVVar12 = p_01;
    iVar1 = Vec_BitCount(p_01);
    uVar2 = 0;
    Abc_Print((int)pVVar12,"ProofReduce: remove %d out of %d white boxes.",
              (ulong)(first_sel_pi - iVar1),(ulong)first_sel_pi);
    aVar10 = Abc_Clock();
    Abc_PrintTime(0x816bb9,(char *)(aVar10 - aVar5),time);
    Vec_IntFree(p_02);
    if (p_01 != (Vec_Bit_t *)0x0) {
      uVar4 = Vec_BitCount(p_01);
      uVar13 = 0;
      if (0 < (int)first_sel_pi) {
        uVar13 = first_sel_pi;
      }
      for (; uVar13 != uVar2; uVar2 = uVar2 + 1) {
        iVar1 = Vec_IntEntry(vBlacks,uVar2);
        iVar11 = Vec_BitEntry(p_01,uVar2);
        if (iVar11 == 0) {
          Vec_BitWriteEntry(pWla->vUnmark,iVar1,0);
        }
      }
      Vec_IntFree(vBlacks);
      Vec_IntFree(vPPIs);
      Vec_BitFree(p_01);
      return (uint)(first_sel_pi != uVar4);
    }
  }
  Vec_IntFree(vBlacks);
  Vec_IntFree(vPPIs);
  return -1;
}

Assistant:

int Wla_ManShrinkAbs( Wla_Man_t * pWla, int nFrames, int RunId )
{
    int i, Entry;
    int RetValue = 0;

    Vec_Int_t * vWhites = Wla_ManCollectNodes( pWla, 0 );
    Vec_Int_t * vBlacks = Wla_ManCollectNodes( pWla, 1 );
    Vec_Bit_t * vCoreMarks = Wlc_NtkProofReduce( pWla->p, pWla->pPars, nFrames, vWhites, vBlacks, RunId );

    if ( vCoreMarks == NULL )
    {
        Vec_IntFree( vWhites );
        Vec_IntFree( vBlacks );
        return -1;
    }

    RetValue = Vec_IntSize( vWhites ) != Vec_BitCount( vCoreMarks );

    Vec_IntForEachEntry( vWhites, Entry, i )
        if ( !Vec_BitEntry( vCoreMarks, i ) )
            Vec_BitWriteEntry( pWla->vUnmark, Entry, 0 );

    Vec_IntFree( vWhites );
    Vec_IntFree( vBlacks );
    Vec_BitFree( vCoreMarks );

    return RetValue;
}